

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transporter.h
# Opt level: O3

void __thiscall
lscpp::transporter::impl<lscpp::stdio_transporter>::~impl(impl<lscpp::stdio_transporter> *this)

{
  char *pcVar1;
  
  (this->super_iface)._vptr_iface = (_func_int **)&PTR__impl_00155568;
  pcVar1 = (this->t_).data_._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
           super__Head_base<0UL,_char_*,_false>._M_head_impl;
  if (pcVar1 != (char *)0x0) {
    operator_delete__(pcVar1);
  }
  (this->t_).data_._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (char *)0x0;
  if ((this->t_).comm_logger_.super__Optional_base<lscpp::comm_logger,_false,_false>._M_payload.
      super__Optional_payload<lscpp::comm_logger,_true,_false,_false>.
      super__Optional_payload_base<lscpp::comm_logger>._M_engaged == true) {
    (this->t_).comm_logger_.super__Optional_base<lscpp::comm_logger,_false,_false>._M_payload.
    super__Optional_payload<lscpp::comm_logger,_true,_false,_false>.
    super__Optional_payload_base<lscpp::comm_logger>._M_engaged = false;
    comm_logger::~comm_logger((comm_logger *)&this->t_);
    return;
  }
  return;
}

Assistant:

impl(Transporter t) : t_(std::move(t)) {}